

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

void __thiscall
Scene::load_buffers_and_draw_cmd
          (Scene *this,shared_ptr<myvk::Queue> *graphics_queue,
          vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> *meshes)

{
  uint32_t uVar1;
  initializer_list<VkBufferCopy> __l;
  initializer_list<VkBufferCopy> __l_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  uint *indices_00;
  uint *vertex_count_00;
  void *vertices_00;
  size_t index_count_00;
  uint *destination;
  uint *remap_00;
  Vertex *vertices_01;
  Vertex *destination_00;
  ulong uVar8;
  const_reference pvVar9;
  element_type *peVar10;
  undefined4 extraout_var;
  Ptr<CommandPool> *command_pool_00;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *pvVar11;
  element_type *this_01;
  element_type *this_02;
  vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> *in_RDX;
  long in_RDI;
  shared_ptr<myvk::CommandBuffer> command_buffer;
  shared_ptr<myvk::CommandPool> command_pool;
  shared_ptr<myvk::Fence> fence;
  shared_ptr<myvk::Buffer> index_staging_buffer;
  shared_ptr<myvk::Buffer> vertex_staging_buffer;
  uint32_t index_buffer_size;
  uint32_t vertex_buffer_size;
  shared_ptr<myvk::Device> *device;
  uint32_t mesh_vert_cnt;
  uint32_t c_1;
  uint32_t i_1;
  uint32_t vertex_count;
  vector<unsigned_int,_std::allocator<unsigned_int>_> remap;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  vector<Vertex,_std::allocator<Vertex>_> vertices;
  Mesh *mesh_1;
  uint32_t c;
  uint32_t i;
  Mesh *mesh;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> *__range1;
  vector<Vertex,_std::allocator<Vertex>_> naive_vertices;
  uint32_t index_count;
  vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> *in_stack_fffffffffffffb58;
  shared_ptr<myvk::Buffer> *__r;
  vector<Vertex,_std::allocator<Vertex>_> *this_03;
  shared_ptr<myvk::Buffer> *in_stack_fffffffffffffb60;
  __normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_>
  *in_stack_fffffffffffffb68;
  allocator<VkBufferCopy> *timeout;
  allocator_type *in_stack_fffffffffffffb70;
  __normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_>
  in_stack_fffffffffffffb78;
  VkCommandBufferUsageFlags usage;
  vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *regions;
  __normal_iterator<const_Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_>
  in_stack_fffffffffffffb80;
  CommandBuffer *pCVar12;
  __normal_iterator<const_Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_>
  in_stack_fffffffffffffb88;
  CommandBuffer *__a;
  vec4 *in_stack_fffffffffffffb90;
  CommandBuffer *this_04;
  undefined1 *puVar13;
  VmaMemoryUsage in_stack_fffffffffffffba4;
  undefined8 in_stack_fffffffffffffba8;
  CommandBuffer *device_00;
  VkDeviceSize in_stack_fffffffffffffbb0;
  __normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_> end;
  Ptr<Device> *in_stack_fffffffffffffbb8;
  __normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_> begin;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
  *in_stack_fffffffffffffbd0;
  VkFenceCreateFlags flags;
  shared_ptr<myvk::Buffer> *device_01;
  VkCommandBufferLevel level;
  uint *in_stack_fffffffffffffc40;
  size_t in_stack_fffffffffffffc48;
  size_t in_stack_fffffffffffffc50;
  allocator<unsigned_int> *destination_01;
  allocator<unsigned_int> *vertex_count_01;
  undefined4 in_stack_fffffffffffffcb8;
  uint32_t in_stack_fffffffffffffcbc;
  vector<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_> *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  uint32_t in_stack_fffffffffffffccc;
  __normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_>
  in_stack_fffffffffffffcd0;
  allocator<VkBufferCopy> local_301;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 in_stack_fffffffffffffd10;
  size_t in_stack_fffffffffffffd18;
  size_t in_stack_fffffffffffffd20;
  float *in_stack_fffffffffffffd28;
  size_t in_stack_fffffffffffffd30;
  uint *in_stack_fffffffffffffd38;
  uint *in_stack_fffffffffffffd40;
  undefined1 local_299 [25];
  undefined1 *local_280;
  undefined8 local_278;
  CommandBuffer local_208;
  undefined1 local_1c8 [32];
  Vertex *local_1a8;
  Vertex *local_1a0;
  vector<Vertex,_std::allocator<Vertex>_> local_188;
  undefined1 local_168 [16];
  shared_ptr<myvk::Buffer> local_158;
  undefined8 local_148;
  Vertex local_140;
  uint local_12c;
  CommandBuffer *local_128;
  size_type local_120;
  int local_114;
  int local_110;
  uint local_10c;
  undefined4 local_108;
  allocator<unsigned_int> local_101 [32];
  allocator<unsigned_int> local_e1;
  undefined1 local_e0 [48];
  Vertex *local_b0;
  Vertex *local_a8;
  Vertex *local_a0;
  Vertex *local_98;
  Vertex *local_90;
  vec<4,float,(glm::qualifier)0> local_88 [16];
  const_reference local_78;
  uint32_t local_6c;
  uint local_68;
  reference local_58;
  Mesh *local_50;
  __normal_iterator<const_Scene::Mesh_*,_std::vector<Scene::Mesh,_std::allocator<Scene::Mesh>_>_>
  local_48;
  vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> *local_40;
  uint local_1c;
  vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> *local_18;
  CommandBuffer *this_00;
  
  local_18 = in_RDX;
  std::vector<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_>::clear
            ((vector<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_> *)0x136dc8);
  local_1c = 0;
  std::vector<Vertex,_std::allocator<Vertex>_>::vector
            ((vector<Vertex,_std::allocator<Vertex>_> *)0x136de0);
  local_40 = local_18;
  local_48._M_current =
       (Mesh *)std::vector<Scene::Mesh,_std::allocator<Scene::Mesh>_>::begin
                         (in_stack_fffffffffffffb58);
  local_50 = (Mesh *)std::vector<Scene::Mesh,_std::allocator<Scene::Mesh>_>::end
                               (in_stack_fffffffffffffb58);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_Scene::Mesh_*,_std::vector<Scene::Mesh,_std::allocator<Scene::Mesh>_>_>
                      ((__normal_iterator<const_Scene::Mesh_*,_std::vector<Scene::Mesh,_std::allocator<Scene::Mesh>_>_>
                        *)in_stack_fffffffffffffb60,
                       (__normal_iterator<const_Scene::Mesh_*,_std::vector<Scene::Mesh,_std::allocator<Scene::Mesh>_>_>
                        *)in_stack_fffffffffffffb58);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    local_58 = __gnu_cxx::
               __normal_iterator<const_Scene::Mesh_*,_std::vector<Scene::Mesh,_std::allocator<Scene::Mesh>_>_>
               ::operator*(&local_48);
    sVar6 = std::vector<Vertex,_std::allocator<Vertex>_>::size(&local_58->m_vertices);
    local_1c = local_1c + (int)sVar6;
    __gnu_cxx::
    __normal_iterator<const_Scene::Mesh_*,_std::vector<Scene::Mesh,_std::allocator<Scene::Mesh>_>_>
    ::operator++(&local_48);
  }
  std::vector<Vertex,_std::allocator<Vertex>_>::resize
            ((vector<Vertex,_std::allocator<Vertex>_> *)in_stack_fffffffffffffb80._M_current,
             (size_type)in_stack_fffffffffffffb78._M_current);
  std::vector<Scene::Mesh,_std::allocator<Scene::Mesh>_>::size(local_18);
  std::vector<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_>::resize
            ((vector<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_> *)
             in_stack_fffffffffffffb80._M_current,(size_type)in_stack_fffffffffffffb78._M_current);
  local_68 = 0;
  local_6c = 0;
  while( true ) {
    uVar5 = (ulong)local_68;
    sVar6 = std::vector<Scene::Mesh,_std::allocator<Scene::Mesh>_>::size(local_18);
    if (sVar6 <= uVar5) break;
    local_78 = std::vector<Scene::Mesh,_std::allocator<Scene::Mesh>_>::operator[]
                         (local_18,(ulong)local_68);
    uVar1 = local_78->m_texture_id;
    pvVar7 = std::vector<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_>::operator[]
                       ((vector<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_> *)(in_RDI + 0x78),
                        (ulong)local_68);
    (pvVar7->m_push_constant).m_texture_id = uVar1;
    glm::vec<4,float,(glm::qualifier)0>::vec<float,float,(glm::qualifier)0>
              (local_88,&local_78->m_albedo,0.0);
    uVar3 = glm::packUnorm4x8(in_stack_fffffffffffffb90);
    in_stack_fffffffffffffcc0 =
         (vector<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_> *)(in_RDI + 0x78);
    pvVar7 = std::vector<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_>::operator[]
                       (in_stack_fffffffffffffcc0,(ulong)local_68);
    (pvVar7->m_push_constant).m_albedo = uVar3;
    in_stack_fffffffffffffcbc = local_6c;
    pvVar7 = std::vector<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_>::operator[]
                       (in_stack_fffffffffffffcc0,(ulong)local_68);
    pvVar7->m_first_index = in_stack_fffffffffffffcbc;
    sVar6 = std::vector<Vertex,_std::allocator<Vertex>_>::size(&local_78->m_vertices);
    in_stack_fffffffffffffccc = (uint32_t)sVar6;
    pvVar7 = std::vector<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_>::operator[]
                       (in_stack_fffffffffffffcc0,(ulong)local_68);
    pvVar7->m_index_count = in_stack_fffffffffffffccc;
    local_90 = (Vertex *)
               std::vector<Vertex,_std::allocator<Vertex>_>::begin
                         ((vector<Vertex,_std::allocator<Vertex>_> *)in_stack_fffffffffffffb58);
    local_98 = (Vertex *)
               std::vector<Vertex,_std::allocator<Vertex>_>::end
                         ((vector<Vertex,_std::allocator<Vertex>_> *)in_stack_fffffffffffffb58);
    local_a8 = (Vertex *)
               std::vector<Vertex,_std::allocator<Vertex>_>::begin
                         ((vector<Vertex,_std::allocator<Vertex>_> *)in_stack_fffffffffffffb58);
    local_a0 = (Vertex *)
               __gnu_cxx::__normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_>
               ::operator+(in_stack_fffffffffffffb68,(difference_type)in_stack_fffffffffffffb60);
    in_stack_fffffffffffffcd0 =
         std::
         copy<__gnu_cxx::__normal_iterator<Vertex_const*,std::vector<Vertex,std::allocator<Vertex>>>,__gnu_cxx::__normal_iterator<Vertex*,std::vector<Vertex,std::allocator<Vertex>>>>
                   (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    local_b0 = in_stack_fffffffffffffcd0._M_current;
    sVar6 = std::vector<Vertex,_std::allocator<Vertex>_>::size(&local_78->m_vertices);
    local_6c = local_6c + (int)sVar6;
    local_68 = local_68 + 1;
  }
  std::vector<Vertex,_std::allocator<Vertex>_>::vector
            ((vector<Vertex,_std::allocator<Vertex>_> *)0x137126);
  uVar5 = (ulong)local_1c;
  vertex_count_01 = &local_e1;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x13714a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffb80._M_current,(size_type)in_stack_fffffffffffffb78._M_current,
             in_stack_fffffffffffffb70);
  std::allocator<unsigned_int>::~allocator(&local_e1);
  indices_00 = (uint *)(ulong)local_1c;
  destination_01 = local_101;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x13719a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffb80._M_current,(size_type)in_stack_fffffffffffffb78._M_current,
             in_stack_fffffffffffffb70);
  std::allocator<unsigned_int>::~allocator(local_101);
  vertex_count_00 =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1371d3);
  vertices_00 = (void *)(ulong)local_1c;
  std::vector<Vertex,_std::allocator<Vertex>_>::data
            ((vector<Vertex,_std::allocator<Vertex>_> *)0x1371f7);
  index_count_00 =
       meshopt_generateVertexRemap
                 ((uint *)in_stack_fffffffffffffcd0._M_current,
                  (uint *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                  (size_t)in_stack_fffffffffffffcc0,
                  (void *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                  (size_t)vertex_count_01,uVar5);
  local_108 = (undefined4)index_count_00;
  std::vector<Vertex,_std::allocator<Vertex>_>::resize
            ((vector<Vertex,_std::allocator<Vertex>_> *)in_stack_fffffffffffffb80._M_current,
             (size_type)in_stack_fffffffffffffb78._M_current);
  destination = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x137261);
  uVar5 = (ulong)local_1c;
  remap_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x137285);
  meshopt_remapIndexBuffer(destination,(uint *)0x0,uVar5,remap_00);
  vertices_01 = std::vector<Vertex,_std::allocator<Vertex>_>::data
                          ((vector<Vertex,_std::allocator<Vertex>_> *)0x1372b0);
  destination_00 =
       std::vector<Vertex,_std::allocator<Vertex>_>::data
                 ((vector<Vertex,_std::allocator<Vertex>_> *)0x1372c5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1372e9);
  meshopt_remapVertexBuffer
            (destination_00,vertices_01,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
             in_stack_fffffffffffffc40);
  std::vector<Vertex,_std::allocator<Vertex>_>::clear
            ((vector<Vertex,_std::allocator<Vertex>_> *)0x137325);
  std::vector<Vertex,_std::allocator<Vertex>_>::shrink_to_fit
            ((vector<Vertex,_std::allocator<Vertex>_> *)0x137332);
  local_10c = 0;
  local_110 = 0;
  while( true ) {
    uVar8 = (ulong)local_10c;
    sVar6 = std::vector<Scene::Mesh,_std::allocator<Scene::Mesh>_>::size(local_18);
    usage = (VkCommandBufferUsageFlags)((ulong)in_stack_fffffffffffffb78._M_current >> 0x20);
    if (sVar6 <= uVar8) break;
    pvVar9 = std::vector<Scene::Mesh,_std::allocator<Scene::Mesh>_>::operator[]
                       (local_18,(ulong)local_10c);
    sVar6 = std::vector<Vertex,_std::allocator<Vertex>_>::size(&pvVar9->m_vertices);
    local_114 = (int)sVar6;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1373b8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1373d8);
    meshopt_optimizeVertexCache
              ((uint *)in_stack_fffffffffffffb70,(uint *)in_stack_fffffffffffffb68,
               (size_t)in_stack_fffffffffffffb60,(size_t)in_stack_fffffffffffffb58);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x137419);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x137439);
    std::vector<Vertex,_std::allocator<Vertex>_>::operator[]
              ((vector<Vertex,_std::allocator<Vertex>_> *)(local_e0 + 0x18),0);
    meshopt_optimizeOverdraw
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
               in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               (float)((ulong)in_stack_fffffffffffffd10 >> 0x20));
    local_110 = local_114 + local_110;
    local_10c = local_10c + 1;
  }
  std::vector<Vertex,_std::allocator<Vertex>_>::data
            ((vector<Vertex,_std::allocator<Vertex>_> *)0x137558);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x13756d);
  std::vector<Vertex,_std::allocator<Vertex>_>::data
            ((vector<Vertex,_std::allocator<Vertex>_> *)0x137591);
  meshopt_optimizeVertexFetch
            (destination_01,indices_00,index_count_00,vertices_00,(size_t)vertex_count_00,uVar5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb70);
  local_120 = std::vector<Vertex,_std::allocator<Vertex>_>::size
                        ((vector<Vertex,_std::allocator<Vertex>_> *)(local_e0 + 0x18));
  spdlog::info<char[32],unsigned_long,unsigned_int&>
            ((char (*) [32])in_stack_fffffffffffffb60,(unsigned_long *)in_stack_fffffffffffffb58,
             (uint *)0x137601);
  peVar10 = std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x137610);
  iVar4 = (*(peVar10->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  this_00 = (CommandBuffer *)CONCAT44(extraout_var,iVar4);
  local_128 = this_00;
  sVar6 = std::vector<Vertex,_std::allocator<Vertex>_>::size
                    ((vector<Vertex,_std::allocator<Vertex>_> *)(local_e0 + 0x18));
  local_12c = (int)sVar6 * 0x14;
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0);
  local_140.m_texcoord.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)((int)sVar6 << 2);
  command_pool_00 = (Ptr<CommandPool> *)(ulong)local_12c;
  local_158.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_158.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_148 = 0;
  __r = &local_158;
  pCVar12 = local_128;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x1376b6);
  level = (VkCommandBufferLevel)((ulong)pCVar12 >> 0x20);
  device_01 = __r;
  myvk::Buffer::Create
            (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
             (VmaAllocationCreateFlags)((ulong)in_stack_fffffffffffffba8 >> 0x20),
             (VkBufferUsageFlags)in_stack_fffffffffffffba8,in_stack_fffffffffffffba4,
             in_stack_fffffffffffffbd0);
  begin._M_current = &local_140;
  std::shared_ptr<myvk::Buffer>::operator=(in_stack_fffffffffffffb60,__r);
  std::shared_ptr<myvk::Buffer>::~shared_ptr((shared_ptr<myvk::Buffer> *)0x137719);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )in_stack_fffffffffffffb70);
  pvVar11 = (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *)
            (ulong)(uint)local_140.m_texcoord.field_1;
  local_188.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_188.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_188.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_03 = &local_188;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x137768);
  myvk::Buffer::Create
            ((Ptr<Device> *)begin._M_current,in_stack_fffffffffffffbb0,
             (VmaAllocationCreateFlags)((ulong)in_stack_fffffffffffffba8 >> 0x20),
             (VkBufferUsageFlags)in_stack_fffffffffffffba8,in_stack_fffffffffffffba4,pvVar11);
  flags = (VkFenceCreateFlags)((ulong)pvVar11 >> 0x20);
  puVar13 = local_168;
  std::shared_ptr<myvk::Buffer>::operator=
            (in_stack_fffffffffffffb60,(shared_ptr<myvk::Buffer> *)this_03);
  std::shared_ptr<myvk::Buffer>::~shared_ptr((shared_ptr<myvk::Buffer> *)0x1377c2);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )in_stack_fffffffffffffb70);
  pvVar11 = (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *)
            (local_e0 + 0x18);
  device_00 = local_128;
  local_1a0 = (Vertex *)std::vector<Vertex,_std::allocator<Vertex>_>::begin(this_03);
  local_1a8 = (Vertex *)std::vector<Vertex,_std::allocator<Vertex>_>::end(this_03);
  local_1c8._0_4_ = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_1c8._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_1c8._8_4_ = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x0;
  local_1c8._12_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  local_1c8._16_8_ = 0;
  end._M_current = (Vertex *)local_1c8;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x137831);
  myvk::Buffer::
  CreateStaging<__gnu_cxx::__normal_iterator<Vertex*,std::vector<Vertex,std::allocator<Vertex>>>>
            ((Ptr<Device> *)device_00,begin,end,pvVar11);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )in_stack_fffffffffffffb70);
  pCVar12 = (CommandBuffer *)local_e0;
  __a = local_128;
  local_208.m_command_buffer =
       (VkCommandBuffer)
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_03);
  local_208.m_command_pool_ptr.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_03);
  local_208.super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x0;
  local_208.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
  .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_208.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
  .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_04 = &local_208;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x1378c9);
  myvk::Buffer::
  CreateStaging<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((Ptr<Device> *)device_00,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )begin._M_current,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )end._M_current,pvVar11);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )in_stack_fffffffffffffb70);
  myvk::Fence::Create((Ptr<Device> *)device_01,flags);
  myvk::CommandPool::Create((Ptr<Queue> *)command_pool_00,level);
  myvk::CommandBuffer::Create(command_pool_00,level);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x137957);
  myvk::CommandBuffer::Begin(pCVar12,usage);
  this_01 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x137973);
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            ((shared_ptr<myvk::BufferBase> *)in_stack_fffffffffffffb60,
             (shared_ptr<myvk::Buffer> *)this_03);
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            ((shared_ptr<myvk::BufferBase> *)in_stack_fffffffffffffb60,
             (shared_ptr<myvk::Buffer> *)this_03);
  local_299._1_8_ = 0;
  local_299._9_8_ = 0;
  local_299._17_8_ = ZEXT48(local_12c);
  local_280 = local_299 + 1;
  local_278 = 1;
  regions = (vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)local_299;
  std::allocator<VkBufferCopy>::allocator((allocator<VkBufferCopy> *)0x1379fb);
  __l._M_len._0_4_ = (int)pvVar11;
  __l._M_array = (iterator)puVar13;
  __l._M_len._4_4_ = (int)((ulong)pvVar11 >> 0x20);
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::vector
            ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)this_04,__l,
             (allocator_type *)__a);
  myvk::CommandBuffer::CmdCopy(this_04,(Ptr<BufferBase> *)__a,(Ptr<BufferBase> *)pCVar12,regions);
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::~vector
            ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)this_01);
  std::allocator<VkBufferCopy>::~allocator((allocator<VkBufferCopy> *)local_299);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x137a6a);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x137a77);
  this_02 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x137a84);
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            ((shared_ptr<myvk::BufferBase> *)this_02,(shared_ptr<myvk::Buffer> *)this_03);
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            ((shared_ptr<myvk::BufferBase> *)this_02,(shared_ptr<myvk::Buffer> *)this_03);
  local_300 = 0;
  local_2f8 = 0;
  timeout = &local_301;
  std::allocator<VkBufferCopy>::allocator((allocator<VkBufferCopy> *)0x137b0c);
  __l_00._M_len._0_4_ = (int)pvVar11;
  __l_00._M_array = (iterator)puVar13;
  __l_00._M_len._4_4_ = (int)((ulong)pvVar11 >> 0x20);
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::vector
            ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)this_04,__l_00,
             (allocator_type *)__a);
  myvk::CommandBuffer::CmdCopy(this_04,(Ptr<BufferBase> *)__a,(Ptr<BufferBase> *)pCVar12,regions);
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::~vector
            ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)this_01);
  std::allocator<VkBufferCopy>::~allocator(&local_301);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x137b7b);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x137b88);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x137b95);
  myvk::CommandBuffer::End((CommandBuffer *)0x137b9d);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x137bac);
  myvk::CommandBuffer::Submit(this_00,(Ptr<Fence> *)command_pool_00);
  std::__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x137bcb)
  ;
  myvk::Fence::Wait((Fence *)this_01,(uint64_t)timeout);
  spdlog::info<char[35]>((char (*) [35])0x137be8);
  std::shared_ptr<myvk::CommandBuffer>::~shared_ptr((shared_ptr<myvk::CommandBuffer> *)0x137bf7);
  std::shared_ptr<myvk::CommandPool>::~shared_ptr((shared_ptr<myvk::CommandPool> *)0x137c04);
  std::shared_ptr<myvk::Fence>::~shared_ptr((shared_ptr<myvk::Fence> *)0x137c11);
  std::shared_ptr<myvk::Buffer>::~shared_ptr((shared_ptr<myvk::Buffer> *)0x137c1e);
  std::shared_ptr<myvk::Buffer>::~shared_ptr((shared_ptr<myvk::Buffer> *)0x137c2b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
  std::vector<Vertex,_std::allocator<Vertex>_>::~vector
            ((vector<Vertex,_std::allocator<Vertex>_> *)this_01);
  std::vector<Vertex,_std::allocator<Vertex>_>::~vector
            ((vector<Vertex,_std::allocator<Vertex>_> *)this_01);
  return;
}

Assistant:

void Scene::load_buffers_and_draw_cmd(const std::shared_ptr<myvk::Queue> &graphics_queue,
                                      const std::vector<Mesh> &meshes) {
	m_draw_commands.clear();

	// count vertices, set draw commands and vertex buffers
	uint32_t index_count = 0;
	std::vector<Vertex> naive_vertices;
	{
		for (const Mesh &mesh : meshes)
			index_count += mesh.m_vertices.size();
		naive_vertices.resize(index_count);
		m_draw_commands.resize(meshes.size());
		for (uint32_t i = 0, c = 0; i < meshes.size(); ++i) {
			const Mesh &mesh = meshes[i];
			m_draw_commands[i].m_push_constant.m_texture_id = mesh.m_texture_id;
			m_draw_commands[i].m_push_constant.m_albedo = glm::packUnorm4x8(glm::vec4(mesh.m_albedo, 0.0f));
			m_draw_commands[i].m_first_index = c;
			m_draw_commands[i].m_index_count = mesh.m_vertices.size();

			std::copy(mesh.m_vertices.begin(), mesh.m_vertices.end(), naive_vertices.begin() + c);
			c += mesh.m_vertices.size();
		}
	}

	// build index buffer and optimize meshes
	std::vector<Vertex> vertices;
	std::vector<uint32_t> indices(index_count);
	{
		std::vector<unsigned int> remap(index_count);
		uint32_t vertex_count = meshopt_generateVertexRemap(remap.data(), nullptr, index_count, naive_vertices.data(),
		                                                    index_count, sizeof(Vertex));
		vertices.resize(vertex_count);
		meshopt_remapIndexBuffer(indices.data(), nullptr, index_count, remap.data());
		meshopt_remapVertexBuffer(vertices.data(), naive_vertices.data(), index_count, sizeof(Vertex), remap.data());
		naive_vertices.clear();
		naive_vertices.shrink_to_fit();

		for (uint32_t i = 0, c = 0; i < meshes.size(); ++i) {
			uint32_t mesh_vert_cnt = meshes[i].m_vertices.size();
			meshopt_optimizeVertexCache(indices.data() + c, indices.data() + c, mesh_vert_cnt, vertex_count);
			meshopt_optimizeOverdraw(indices.data() + c, indices.data() + c, mesh_vert_cnt, &vertices[0].m_position.x,
			                         vertex_count, sizeof(Vertex), 1.05f);
			c += mesh_vert_cnt;
		}
		meshopt_optimizeVertexFetch(vertices.data(), indices.data(), index_count, vertices.data(), vertex_count,
		                            sizeof(Vertex));
	}
	spdlog::info("Mesh optimized ({}/{} vertices)", vertices.size(), index_count);

	const std::shared_ptr<myvk::Device> &device = graphics_queue->GetDevicePtr();
	uint32_t vertex_buffer_size = vertices.size() * sizeof(Vertex),
	         index_buffer_size = indices.size() * sizeof(uint32_t);
	m_vertex_buffer = myvk::Buffer::Create(device, vertex_buffer_size, 0,
	                                       VK_BUFFER_USAGE_VERTEX_BUFFER_BIT | VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	m_index_buffer = myvk::Buffer::Create(device, index_buffer_size, 0,
	                                      VK_BUFFER_USAGE_INDEX_BUFFER_BIT | VK_BUFFER_USAGE_TRANSFER_DST_BIT);

	std::shared_ptr<myvk::Buffer> vertex_staging_buffer =
	    myvk::Buffer::CreateStaging(device, vertices.begin(), vertices.end());
	std::shared_ptr<myvk::Buffer> index_staging_buffer =
	    myvk::Buffer::CreateStaging(device, indices.begin(), indices.end());

	std::shared_ptr<myvk::Fence> fence = myvk::Fence::Create(device);
	std::shared_ptr<myvk::CommandPool> command_pool = myvk::CommandPool::Create(graphics_queue);
	std::shared_ptr<myvk::CommandBuffer> command_buffer = myvk::CommandBuffer::Create(command_pool);
	command_buffer->Begin(VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT);
	command_buffer->CmdCopy(vertex_staging_buffer, m_vertex_buffer, {{0, 0, vertex_buffer_size}});
	command_buffer->CmdCopy(index_staging_buffer, m_index_buffer, {{0, 0, index_buffer_size}});
	command_buffer->End();
	command_buffer->Submit(fence);

	fence->Wait();

	spdlog::info("Vertex and Index buffers generated");
}